

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# case_expression.hpp
# Opt level: O2

string * __thiscall
duckdb::CaseExpression::ToString<duckdb::CaseExpression,duckdb::ParsedExpression>
          (string *__return_storage_ptr__,CaseExpression *this,CaseExpression *entry)

{
  pointer pCVar1;
  pointer pPVar2;
  pointer this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,"CASE ",(allocator *)&local_70);
  pCVar1 = (this->case_checks).super_vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>.
           super__Vector_base<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (this_00 = (this->case_checks).
                 super_vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>.
                 super__Vector_base<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>._M_impl.
                 super__Vector_impl_data._M_start; this_00 != pCVar1; this_00 = this_00 + 1) {
    pPVar2 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->(&this_00->when_expr);
    (*(pPVar2->super_BaseExpression)._vptr_BaseExpression[8])(&local_50,pPVar2);
    ::std::operator+(&local_90," WHEN (",&local_50);
    ::std::operator+(&local_70,&local_90,")");
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&local_70);
    ::std::__cxx11::string::~string((string *)&local_90);
    ::std::__cxx11::string::~string((string *)&local_50);
    pPVar2 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->(&this_00->then_expr);
    (*(pPVar2->super_BaseExpression)._vptr_BaseExpression[8])(&local_50,pPVar2);
    ::std::operator+(&local_90," THEN (",&local_50);
    ::std::operator+(&local_70,&local_90,")");
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&local_70);
    ::std::__cxx11::string::~string((string *)&local_90);
    ::std::__cxx11::string::~string((string *)&local_50);
  }
  pPVar2 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->(&this->else_expr);
  (*(pPVar2->super_BaseExpression)._vptr_BaseExpression[8])(&local_90,pPVar2);
  ::std::operator+(&local_70," ELSE ",&local_90);
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

static string ToString(const T &entry) {
		string case_str = "CASE ";
		for (auto &check : entry.case_checks) {
			case_str += " WHEN (" + check.when_expr->ToString() + ")";
			case_str += " THEN (" + check.then_expr->ToString() + ")";
		}
		case_str += " ELSE " + entry.else_expr->ToString();
		case_str += " END";
		return case_str;
	}